

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::FinishCommandList
          (DeviceContextVkImpl *this,ICommandList **ppCommandList)

{
  bool bVar1;
  Char *pCVar2;
  RenderPassVkImpl *pRVar3;
  DeviceContextVkImpl *local_d0;
  MakeNewRCObj<Diligent::CommandListVkImpl,_Diligent::FixedBlockMemoryAllocator> local_c8;
  CommandListVkImpl *local_a0;
  CommandListVkImpl *pCmdListVk;
  string msg_2;
  VkCommandBuffer pVStack_70;
  VkResult err;
  VkCommandBuffer vkCmdBuff;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  ICommandList **ppCommandList_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = ppCommandList;
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  if (!bVar1) {
    FormatString<char[46]>
              ((string *)local_38,(char (*) [46])"Only deferred context can record command list");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb0b);
    std::__cxx11::string::~string((string *)local_38);
  }
  pRVar3 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
  if (pRVar3 != (RenderPassVkImpl *)0x0) {
    FormatString<char[53]>
              ((string *)&vkCmdBuff,
               (char (*) [53])"Finishing command list inside an active render pass.");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb0c);
    std::__cxx11::string::~string((string *)&vkCmdBuff);
  }
  EndRenderScope(this);
  pVStack_70 = VulkanUtilities::VulkanCommandBuffer::GetVkCmdBuffer(&this->m_CommandBuffer);
  msg_2.field_2._12_4_ = (*vkEndCommandBuffer)(pVStack_70);
  if (msg_2.field_2._12_4_ != VK_SUCCESS) {
    FormatString<char[29]>((string *)&pCmdListVk,(char (*) [29])"Failed to end command buffer");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb12);
    std::__cxx11::string::~string((string *)&pCmdListVk);
  }
  MakeNewRCObj<Diligent::CommandListVkImpl,_Diligent::FixedBlockMemoryAllocator>::MakeNewRCObj
            (&local_c8,&this->m_CmdListAllocator,"CommandListVkImpl instance",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
             ,0xb15,(IObject *)0x0);
  local_d0 = this;
  local_a0 = MakeNewRCObj<Diligent::CommandListVkImpl,Diligent::FixedBlockMemoryAllocator>::
             operator()((MakeNewRCObj<Diligent::CommandListVkImpl,Diligent::FixedBlockMemoryAllocator>
                         *)&local_c8,
                        &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice,&local_d0,
                        &stack0xffffffffffffff90);
  CommandListBase<Diligent::EngineVkImplTraits>::QueryInterface
            (&local_a0->super_CommandListBase<Diligent::EngineVkImplTraits>,
             (INTERFACE_ID *)IID_CommandList,(IObject **)msg.field_2._8_8_);
  VulkanUtilities::VulkanCommandBuffer::Reset(&this->m_CommandBuffer);
  (this->m_State).CommittedVBsUpToDate = false;
  (this->m_State).CommittedIBUpToDate = false;
  (this->m_State).ShadingRateIsSet = false;
  (this->m_State).NullRenderTargets = false;
  (this->m_State).NumCommands = 0;
  (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_MAX_ENUM;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState,
             (PipelineStateVkImpl *)0x0);
  this->m_pQueryMgr = (QueryManagerVk *)0x0;
  InvalidateState(this);
  DeviceContextBase<Diligent::EngineVkImplTraits>::FinishCommandList
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  return;
}

Assistant:

void DeviceContextVkImpl::FinishCommandList(ICommandList** ppCommandList)
{
    DEV_CHECK_ERR(IsDeferred(), "Only deferred context can record command list");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Finishing command list inside an active render pass.");

    EndRenderScope();

    VkCommandBuffer vkCmdBuff = m_CommandBuffer.GetVkCmdBuffer();
    VkResult        err       = vkEndCommandBuffer(vkCmdBuff);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to end command buffer");
    (void)err;

    CommandListVkImpl* pCmdListVk{NEW_RC_OBJ(m_CmdListAllocator, "CommandListVkImpl instance", CommandListVkImpl)(m_pDevice, this, vkCmdBuff)};
    pCmdListVk->QueryInterface(IID_CommandList, reinterpret_cast<IObject**>(ppCommandList));

    m_CommandBuffer.Reset();
    m_State          = ContextState{};
    m_pPipelineState = nullptr;
    m_pQueryMgr      = nullptr;

    InvalidateState();

    TDeviceContextBase::FinishCommandList();
}